

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_make_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int type,float v,Option *opt
               )

{
  Layer *pLVar1;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  int in_stack_00000008;
  undefined8 in_stack_00000010;
  ParamDict pd;
  Layer *padding;
  undefined8 in_stack_fffffffffffff6b8;
  ParamDict *in_stack_fffffffffffff6c0;
  undefined1 local_930 [32];
  ParamDict *in_stack_fffffffffffff6f0;
  
  pLVar1 = create_layer((int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
  ParamDict::ParamDict(in_stack_fffffffffffff6f0);
  ParamDict::set((ParamDict *)local_930,0,in_EDX);
  ParamDict::set((ParamDict *)local_930,1,in_ECX);
  ParamDict::set((ParamDict *)local_930,2,in_R8D);
  ParamDict::set((ParamDict *)local_930,3,in_R9D);
  ParamDict::set((ParamDict *)local_930,4,in_stack_00000008);
  ParamDict::set((ParamDict *)local_930,5,in_XMM0_Da);
  (*pLVar1->_vptr_Layer[2])(pLVar1,local_930);
  (*pLVar1->_vptr_Layer[7])(pLVar1,in_RDI,in_RSI,in_stack_00000010);
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(in_stack_fffffffffffff6c0);
  return;
}

Assistant:

void copy_make_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int type, float v, const Option& opt)
{
    ncnn::Layer* padding = ncnn::create_layer(ncnn::LayerType::Padding);

    ncnn::ParamDict pd;
    pd.set(0, top);
    pd.set(1, bottom);
    pd.set(2, left);
    pd.set(3, right);
    pd.set(4, type);
    pd.set(5, v);

    padding->load_param(pd);

    padding->forward(src, dst, opt);

    delete padding;
}